

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext *ctx,ImGuiWindow *window,bool clear_persistent_docking_ref)

{
  undefined1 in_DL;
  ImGuiDockNode *in_RSI;
  undefined7 in_stack_ffffffffffffffe8;
  
  if (in_RSI[5].HostWindow == (ImGuiWindow *)0x0) {
    *(undefined4 *)&in_RSI[5].CentralNode = 0;
  }
  else {
    DockNodeRemoveWindow
              (in_RSI,(ImGuiWindow *)(CONCAT17(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffffffffffff)
               ,(ImGuiID)((ulong)in_RSI >> 0x20));
  }
  in_RSI->field_0xb2 = 0;
  *(byte *)((long)&in_RSI[5].LastFrameFocused + 2) =
       *(byte *)((long)&in_RSI[5].LastFrameFocused + 2) & 0xfe;
  *(byte *)((long)&in_RSI[5].LastFrameFocused + 2) =
       *(byte *)((long)&in_RSI[5].LastFrameFocused + 2) & 0xfd;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    (void)ctx;
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockTabIsVisible = false;
    MarkIniSettingsDirty();
}